

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_305e10::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile
          (JobEvalCacheUicT *this,SourceFileHandleT *sourceFileHandle)

{
  element_type *peVar1;
  element_type *peVar2;
  IncludeKeyT *pIVar3;
  bool bVar4;
  char *in_RCX;
  __normal_iterator<const_(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT_*,_std::vector<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>_>
  __it;
  long lVar5;
  long lVar6;
  __normal_iterator<const_(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT_*,_std::vector<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>_>
  _Var7;
  string_view filename;
  string sourceDirPrefix;
  JobEvalCacheUicT *local_70;
  string *local_68;
  element_type *local_60;
  SourceFileHandleT *local_58;
  string local_50;
  
  peVar1 = (sourceFileHandle->
           super___shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar1->Uic != true) {
    return true;
  }
  peVar2 = (peVar1->ParseData).
           super___shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (*(pointer *)
       &(peVar2->Uic).Include.
        super__Vector_base<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>
        ._M_impl ==
      *(pointer *)
       ((long)&(peVar2->Uic).Include.
               super__Vector_base<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>
       + 8)) {
    return true;
  }
  filename._M_str = in_RCX;
  filename._M_len = (size_t)(peVar1->FileName)._M_dataplus._M_p;
  cmQtAutoGen::SubDirPrefix_abi_cxx11_
            (&local_50,(cmQtAutoGen *)(peVar1->FileName)._M_string_length,filename);
  __it._M_current =
       *(IncludeKeyT **)
        &(peVar2->Uic).Include.
         super__Vector_base<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>
         ._M_impl;
  pIVar3 = *(pointer *)
            ((long)&(peVar2->Uic).Include.
                    super__Vector_base<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT,_std::allocator<(anonymous_namespace)::cmQtAutoMocUicT::IncludeKeyT>_>
            + 8);
  lVar6 = (long)pIVar3 - (long)__it._M_current;
  lVar5 = (lVar6 >> 5) * -0x5555555555555555 >> 2;
  local_70 = this;
  local_68 = &local_50;
  local_60 = peVar1;
  local_58 = sourceFileHandle;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_negate<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>const&)::$_0>
              ::operator()((_Iter_negate<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>const&)::__0>
                            *)&local_70,__it);
      _Var7._M_current = __it._M_current;
      if (bVar4) goto LAB_001ca591;
      bVar4 = __gnu_cxx::__ops::
              _Iter_negate<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>const&)::$_0>
              ::operator()((_Iter_negate<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>const&)::__0>
                            *)&local_70,__it._M_current + 1);
      _Var7._M_current = __it._M_current + 1;
      if (bVar4) goto LAB_001ca591;
      bVar4 = __gnu_cxx::__ops::
              _Iter_negate<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>const&)::$_0>
              ::operator()((_Iter_negate<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>const&)::__0>
                            *)&local_70,__it._M_current + 2);
      _Var7._M_current = __it._M_current + 2;
      if (bVar4) goto LAB_001ca591;
      bVar4 = __gnu_cxx::__ops::
              _Iter_negate<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>const&)::$_0>
              ::operator()((_Iter_negate<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>const&)::__0>
                            *)&local_70,__it._M_current + 3);
      _Var7._M_current = __it._M_current + 3;
      if (bVar4) goto LAB_001ca591;
      __it._M_current = __it._M_current + 4;
      lVar5 = lVar5 + -1;
      lVar6 = lVar6 + -0x180;
    } while (1 < lVar5);
  }
  lVar5 = (lVar6 >> 5) * -0x5555555555555555;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var7._M_current = pIVar3;
      if ((lVar5 != 3) ||
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_negate<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>const&)::$_0>
                  ::operator()((_Iter_negate<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>const&)::__0>
                                *)&local_70,__it), _Var7._M_current = __it._M_current, bVar4))
      goto LAB_001ca591;
      __it._M_current = __it._M_current + 1;
    }
    bVar4 = __gnu_cxx::__ops::
            _Iter_negate<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>const&)::$_0>
            ::operator()((_Iter_negate<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>const&)::__0>
                          *)&local_70,__it);
    _Var7._M_current = __it._M_current;
    if (bVar4) goto LAB_001ca591;
    __it._M_current = __it._M_current + 1;
  }
  bVar4 = __gnu_cxx::__ops::
          _Iter_negate<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>const&)::$_0>
          ::operator()((_Iter_negate<(anonymous_namespace)::cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(std::shared_ptr<(anonymous_namespace)::cmQtAutoMocUicT::SourceFileT>const&)::__0>
                        *)&local_70,__it);
  _Var7._M_current = __it._M_current;
  if (!bVar4) {
    _Var7._M_current = pIVar3;
  }
LAB_001ca591:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return _Var7._M_current == pIVar3;
}

Assistant:

bool cmQtAutoMocUicT::JobEvalCacheUicT::EvalFile(
  SourceFileHandleT const& sourceFileHandle)
{
  SourceFileT const& sourceFile = *sourceFileHandle;
  auto const& Include = sourceFile.ParseData->Uic.Include;
  if (!sourceFile.Uic || Include.empty()) {
    return true;
  }

  std::string const sourceDirPrefix = SubDirPrefix(sourceFile.FileName);
  return std::all_of(
    Include.begin(), Include.end(),
    [this, &sourceDirPrefix, &sourceFile,
     &sourceFileHandle](IncludeKeyT const& incKey) -> bool {
      // Find .ui file
      this->UiName = cmStrCat(incKey.Base, ".ui");
      if (!this->FindIncludedUi(sourceDirPrefix, incKey.Dir)) {
        this->LogError(
          GenT::UIC,
          cmStrCat(this->MessagePath(sourceFile.FileName),
                   "\nincludes the uic file ", this->MessagePath(incKey.Key),
                   ",\nbut the user interface file ",
                   this->MessagePath(this->UiName),
                   "\ncould not be found in the following directories\n",
                   this->MessageSearchLocations()));
        return false;
      }
      // Check if the file is skipped
      if (this->UicConst().skipped(this->UiFileHandle->FileName)) {
        return true;
      }
      // Register mapping
      return this->RegisterMapping(incKey.Key, sourceFileHandle);
    });
}